

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

void register_multipage(uc_struct_conflict15 *uc,FlatView *fv,MemoryRegionSection *section)

{
  ulong uVar1;
  undefined1 a [16];
  undefined1 a_00 [16];
  uint16_t leaf;
  AddressSpaceDispatch *d_00;
  Int128 *pIVar2;
  uint64_t nb;
  undefined8 extraout_RDX;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  uint64_t num_pages;
  uint16_t section_index;
  hwaddr start_addr;
  AddressSpaceDispatch *d;
  MemoryRegionSection *section_local;
  FlatView *fv_local;
  uc_struct_conflict15 *uc_local;
  
  d_00 = flatview_to_dispatch(fv);
  uVar1 = section->offset_within_address_space;
  leaf = phys_section_add(uc,&d_00->map,section);
  a._8_8_ = in_stack_ffffffffffffff90;
  a._0_8_ = in_stack_ffffffffffffff88;
  pIVar2 = int128_rshift(*(Int128 **)&section->size,(Int128)a,
                         (int)*(undefined8 *)((long)&section->size + 8));
  a_00._8_8_ = extraout_RDX;
  a_00._0_8_ = pIVar2;
  nb = int128_get64((Int128)a_00);
  if (nb != 0) {
    phys_page_set(d_00,uVar1 >> 0xe,nb,leaf);
    return;
  }
  __assert_fail("num_pages",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                ,0x38d,
                "void register_multipage(struct uc_struct *, FlatView *, MemoryRegionSection *)");
}

Assistant:

static void register_multipage(struct uc_struct *uc, FlatView *fv,
                               MemoryRegionSection *section)
{
    AddressSpaceDispatch *d = flatview_to_dispatch(fv);
    hwaddr start_addr = section->offset_within_address_space;
    uint16_t section_index = phys_section_add(uc, &d->map, section);
    uint64_t num_pages = int128_get64(int128_rshift(section->size,
                                                    TARGET_PAGE_BITS));

    assert(num_pages);
    phys_page_set(d, start_addr >> TARGET_PAGE_BITS, num_pages, section_index);
}